

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O3

TARGET_LEVEL_FAIL_ID
check_level_constraints
          (AV1LevelInfo *level_info,AV1_LEVEL level,int tier,int is_still_picture,
          BITSTREAM_PROFILE profile,int check_bitrate)

{
  double *pdVar1;
  DECODER_MODEL_STATUS DVar2;
  int iVar3;
  int iVar4;
  TARGET_LEVEL_FAIL_ID TVar5;
  long lVar6;
  long lVar7;
  undefined7 in_register_00000031;
  ulong uVar8;
  ulong uVar9;
  AV1_LEVEL *pAVar10;
  double dVar11;
  
  uVar8 = CONCAT71(in_register_00000031,level) & 0xffffffff;
  DVar2 = level_info->decoder_models[uVar8].status;
  if ((DVar2 == '\a') || (TVar5 = DECODER_MODEL_FAIL, DVar2 == '\0')) {
    uVar9 = (ulong)(uint)((int)CONCAT71(in_register_00000031,level) * 0x50);
    TVar5 = LUMA_PIC_SIZE_TOO_LARGE;
    if ((level_info->level_spec).max_picture_size <=
        *(int *)((long)&av1_level_defs[0].max_picture_size + uVar9)) {
      pAVar10 = &av1_level_defs[0].level + uVar9;
      TVar5 = LUMA_PIC_H_SIZE_TOO_LARGE;
      if ((((level_info->level_spec).max_h_size <=
            *(int *)((long)&av1_level_defs[0].max_h_size + uVar9)) &&
          (TVar5 = LUMA_PIC_V_SIZE_TOO_LARGE,
          (level_info->level_spec).max_v_size <=
          *(int *)((long)&av1_level_defs[0].max_v_size + uVar9))) &&
         (TVar5 = TOO_MANY_TILE_COLUMNS,
         (level_info->level_spec).max_tile_cols <=
         *(int *)((long)&av1_level_defs[0].max_tile_cols + uVar9))) {
        iVar3 = *(int *)((long)&av1_level_defs[0].max_tiles + uVar9);
        TVar5 = TOO_MANY_TILES;
        if ((level_info->level_spec).max_tiles <= iVar3) {
          iVar4 = (level_info->level_spec).max_header_rate;
          TVar5 = FRAME_HEADER_RATE_TOO_HIGH;
          if (iVar4 <= *(int *)((long)&av1_level_defs[0].max_header_rate + uVar9)) {
            dVar11 = (double)*(long *)((long)&av1_level_defs[0].max_display_rate + uVar9);
            TVar5 = DISPLAY_RATE_TOO_HIGH;
            if (level_info->decoder_models[uVar8].max_display_rate <= dVar11) {
              lVar7 = (level_info->level_spec).max_decode_rate;
              TVar5 = DECODE_RATE_TOO_HIGH;
              if ((lVar7 <= *(long *)((long)&av1_level_defs[0].max_decode_rate + uVar9)) &&
                 (TVar5 = TILE_RATE_TOO_HIGH, (level_info->level_spec).max_tile_rate <= iVar3 * 0x78
                 )) {
                iVar3 = (level_info->level_stats).max_tile_size;
                TVar5 = TILE_TOO_LARGE;
                if ((((iVar3 < 0x900001) &&
                     ((TVar5 = SUPERRES_TILE_WIDTH_TOO_LARGE,
                      (level_info->level_stats).max_superres_tile_width < 0x1001 &&
                      (TVar5 = CROPPED_TILE_WIDTH_TOO_SMALL,
                      7 < (level_info->level_stats).min_cropped_tile_width)))) &&
                    (TVar5 = CROPPED_TILE_HEIGHT_TOO_SMALL,
                    7 < (level_info->level_stats).min_cropped_tile_height)) &&
                   ((TVar5 = LUMA_PIC_H_SIZE_TOO_SMALL,
                    0xf < (level_info->level_stats).min_frame_width &&
                    (TVar5 = LUMA_PIC_V_SIZE_TOO_SMALL,
                    0xf < (level_info->level_stats).min_frame_height)))) {
                  if ((level_info->level_stats).tile_width_is_valid == 0) {
                    TVar5 = TILE_WIDTH_INVALID;
                  }
                  else {
                    if (is_still_picture == 0) {
                      lVar6 = 0x40;
                      if (tier != 0) {
                        lVar6 = (ulong)(7 < *pAVar10) * 8 + 0x40;
                      }
                      dVar11 = ((double)lVar7 / dVar11) * *(double *)(pAVar10 + lVar6);
                      if (dVar11 <= 0.8) {
                        dVar11 = 0.8;
                      }
                    }
                    else {
                      dVar11 = 0.8;
                    }
                    TVar5 = CR_TOO_SMALL;
                    pdVar1 = &(level_info->level_stats).min_cr;
                    if (dVar11 < *pdVar1 || dVar11 == *pdVar1) {
                      if (check_bitrate != 0) {
                        lVar7 = 0x30;
                        if (tier != 0) {
                          lVar7 = (ulong)(7 < *pAVar10) * 8 + 0x30;
                        }
                        if (profile == '\0') {
                          dVar11 = 1.0;
                        }
                        else {
                          dVar11 = *(double *)(&DAT_004e0270 + (ulong)(profile == '\x01') * 8);
                        }
                        if (*(double *)(pAVar10 + lVar7) * 1000000.0 * dVar11 <
                            ((level_info->level_stats).total_compressed_size * 8.0) /
                            (level_info->level_stats).total_time_encoded) {
                          return BITRATE_TOO_HIGH;
                        }
                      }
                      TVar5 = TARGET_LEVEL_OK;
                      if (0xd < *pAVar10) {
                        TVar5 = (uint)(iVar3 * iVar4 < 0x23100001) * 4 +
                                TILE_SIZE_HEADER_RATE_TOO_HIGH;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return TVar5;
}

Assistant:

static TARGET_LEVEL_FAIL_ID check_level_constraints(
    const AV1LevelInfo *const level_info, AV1_LEVEL level, int tier,
    int is_still_picture, BITSTREAM_PROFILE profile, int check_bitrate) {
  const DECODER_MODEL *const decoder_model = &level_info->decoder_models[level];
  const DECODER_MODEL_STATUS decoder_model_status = decoder_model->status;
  if (decoder_model_status != DECODER_MODEL_OK &&
      decoder_model_status != DECODER_MODEL_DISABLED) {
    return DECODER_MODEL_FAIL;
  }

  const AV1LevelSpec *const level_spec = &level_info->level_spec;
  const AV1LevelSpec *const target_level_spec = &av1_level_defs[level];
  const AV1LevelStats *const level_stats = &level_info->level_stats;
  TARGET_LEVEL_FAIL_ID fail_id = TARGET_LEVEL_OK;
  do {
    if (level_spec->max_picture_size > target_level_spec->max_picture_size) {
      fail_id = LUMA_PIC_SIZE_TOO_LARGE;
      break;
    }

    if (level_spec->max_h_size > target_level_spec->max_h_size) {
      fail_id = LUMA_PIC_H_SIZE_TOO_LARGE;
      break;
    }

    if (level_spec->max_v_size > target_level_spec->max_v_size) {
      fail_id = LUMA_PIC_V_SIZE_TOO_LARGE;
      break;
    }

    if (level_spec->max_tile_cols > target_level_spec->max_tile_cols) {
      fail_id = TOO_MANY_TILE_COLUMNS;
      break;
    }

    if (level_spec->max_tiles > target_level_spec->max_tiles) {
      fail_id = TOO_MANY_TILES;
      break;
    }

    if (level_spec->max_header_rate > target_level_spec->max_header_rate) {
      fail_id = FRAME_HEADER_RATE_TOO_HIGH;
      break;
    }

    if (decoder_model->max_display_rate >
        (double)target_level_spec->max_display_rate) {
      fail_id = DISPLAY_RATE_TOO_HIGH;
      break;
    }

    // TODO(huisu): we are not using max decode rate calculated by the decoder
    // model because the model in resource availability mode always returns
    // MaxDecodeRate(as in the level definitions) as the max decode rate.
    if (level_spec->max_decode_rate > target_level_spec->max_decode_rate) {
      fail_id = DECODE_RATE_TOO_HIGH;
      break;
    }

    if (level_spec->max_tile_rate > target_level_spec->max_tiles * 120) {
      fail_id = TILE_RATE_TOO_HIGH;
      break;
    }

#if CONFIG_CWG_C013
    const int max_tile_size = (level >= SEQ_LEVEL_7_0 && level <= SEQ_LEVEL_8_3)
                                  ? MAX_TILE_AREA_LEVEL_7_AND_ABOVE
                                  : MAX_TILE_AREA;
#else
    const int max_tile_size = MAX_TILE_AREA;
#endif
    if (level_stats->max_tile_size > max_tile_size) {
      fail_id = TILE_TOO_LARGE;
      break;
    }

    if (level_stats->max_superres_tile_width > MAX_TILE_WIDTH) {
      fail_id = SUPERRES_TILE_WIDTH_TOO_LARGE;
      break;
    }

    if (level_stats->min_cropped_tile_width < MIN_CROPPED_TILE_WIDTH) {
      fail_id = CROPPED_TILE_WIDTH_TOO_SMALL;
      break;
    }

    if (level_stats->min_cropped_tile_height < MIN_CROPPED_TILE_HEIGHT) {
      fail_id = CROPPED_TILE_HEIGHT_TOO_SMALL;
      break;
    }

    if (level_stats->min_frame_width < MIN_FRAME_WIDTH) {
      fail_id = LUMA_PIC_H_SIZE_TOO_SMALL;
      break;
    }

    if (level_stats->min_frame_height < MIN_FRAME_HEIGHT) {
      fail_id = LUMA_PIC_V_SIZE_TOO_SMALL;
      break;
    }

    if (!level_stats->tile_width_is_valid) {
      fail_id = TILE_WIDTH_INVALID;
      break;
    }

    const double min_cr = get_min_cr(target_level_spec, tier, is_still_picture,
                                     level_spec->max_decode_rate);
    if (level_stats->min_cr < min_cr) {
      fail_id = CR_TOO_SMALL;
      break;
    }

    if (check_bitrate) {
      // Check average bitrate instead of max_bitrate.
      const double bitrate_limit =
          get_max_bitrate(target_level_spec, tier, profile);
      const double avg_bitrate = level_stats->total_compressed_size * 8.0 /
                                 level_stats->total_time_encoded;
      if (avg_bitrate > bitrate_limit) {
        fail_id = BITRATE_TOO_HIGH;
        break;
      }
    }

    if (target_level_spec->level > SEQ_LEVEL_5_1) {
      int temporal_parallel_num;
      int temporal_parallel_denom;
      const int scalability_mode_idc = -1;
      get_temporal_parallel_params(scalability_mode_idc, &temporal_parallel_num,
                                   &temporal_parallel_denom);
      const int val = level_stats->max_tile_size * level_spec->max_header_rate *
                      temporal_parallel_denom / temporal_parallel_num;
      if (val > MAX_TILE_SIZE_HEADER_RATE_PRODUCT) {
        fail_id = TILE_SIZE_HEADER_RATE_TOO_HIGH;
        break;
      }
    }
  } while (0);

  return fail_id;
}